

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O0

gs_stmt_t *
gs_stmt_for_new(gs_parser_t *parser,gs_token_t token,gs_val_type decl_type,gs_token_t decl_symbol,
               gs_expr_t *init,gs_expr_t *cond,gs_expr_t *inc,gs_stmt_t *body)

{
  gs_stmt_t *pgVar1;
  gs_stmt_t *stmt;
  gs_stmt_t *body_local;
  gs_expr_t *inc_local;
  gs_expr_t *cond_local;
  gs_expr_t *init_local;
  gs_val_type decl_type_local;
  gs_parser_t *parser_local;
  
  pgVar1 = (gs_stmt_t *)gs_parser_alloc(parser,0x48);
  pgVar1->type = GS_STMT_FOR;
  (pgVar1->field_1).for_stmt.decl_type = decl_type;
  (pgVar1->field_1).if_stmt.conds = (gs_expr_t **)decl_symbol._0_8_;
  (pgVar1->field_1).if_stmt.stmts = (gs_stmt_t **)decl_symbol._8_8_;
  (pgVar1->field_1).if_stmt.else_stmt = (gs_stmt_t *)decl_symbol.field_3;
  (pgVar1->field_1).for_stmt.init = init;
  (pgVar1->field_1).for_stmt.cond = cond;
  (pgVar1->field_1).for_stmt.inc = inc;
  (pgVar1->field_1).for_stmt.body = body;
  return pgVar1;
}

Assistant:

static gs_stmt_t *gs_stmt_for_new(gs_parser_t *parser, gs_token_t token, gs_val_type decl_type, gs_token_t decl_symbol, gs_expr_t *init, gs_expr_t *cond, gs_expr_t *inc, gs_stmt_t *body) {
    GOLF_UNUSED(token);
    gs_stmt_t *stmt = gs_parser_alloc(parser, sizeof(gs_stmt_t));
    stmt->type = GS_STMT_FOR;
    stmt->for_stmt.decl_type = decl_type;
    stmt->for_stmt.decl_symbol = decl_symbol;
    stmt->for_stmt.init = init;
    stmt->for_stmt.cond = cond;
    stmt->for_stmt.inc = inc;
    stmt->for_stmt.body = body;
    return stmt;
}